

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

void DefineSourceFileProperty(void *arg,char *name,char *briefDocs,char *longDocs,int chained)

{
  cmState *this;
  char *__s;
  allocator<char> local_ac;
  allocator<char> local_ab;
  allocator<char> local_aa;
  allocator<char> local_a9;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  this = cmMakefile::GetState((cmMakefile *)arg);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,name,&local_a9);
  if (briefDocs == (char *)0x0) {
    briefDocs = "";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,briefDocs,&local_aa);
  __s = "";
  if (longDocs != (char *)0x0) {
    __s = longDocs;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,__s,&local_ab);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_ac);
  cmState::DefineProperty(this,&local_68,SOURCE_FILE,&local_88,&local_a8,chained != 0,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

static void CCONV DefineSourceFileProperty(void* arg, const char* name,
                                           const char* briefDocs,
                                           const char* longDocs, int chained)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  mf->GetState()->DefineProperty(name, cmProperty::SOURCE_FILE,
                                 briefDocs ? briefDocs : "",
                                 longDocs ? longDocs : "", chained != 0);
}